

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentGeneral.cpp
# Opt level: O0

bool __thiscall
DIS::EnvironmentGeneral::operator==(EnvironmentGeneral *this,EnvironmentGeneral *rhs)

{
  bool local_19;
  bool ivarsEqual;
  EnvironmentGeneral *rhs_local;
  EnvironmentGeneral *this_local;
  
  local_19 = this->_length == rhs->_length && this->_environmentType == rhs->_environmentType;
  if (this->_index != rhs->_index) {
    local_19 = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    local_19 = false;
  }
  if (this->_geometry != rhs->_geometry) {
    local_19 = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool EnvironmentGeneral::operator ==(const EnvironmentGeneral& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_environmentType == rhs._environmentType) ) ivarsEqual = false;
     if( ! (_length == rhs._length) ) ivarsEqual = false;
     if( ! (_index == rhs._index) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_geometry == rhs._geometry) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }